

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * setban(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff308;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff310;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff340;
  UniValue *in_stack_fffffffffffff348;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff350;
  RPCArgOptions *in_stack_fffffffffffff358;
  string *in_stack_fffffffffffff360;
  Fallback *in_stack_fffffffffffff368;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff370;
  string *in_stack_fffffffffffff378;
  RPCArg *in_stack_fffffffffffff380;
  RPCResults *in_stack_fffffffffffff388;
  RPCResult *this_00;
  RPCHelpMan *examples;
  RPCResults *in_stack_fffffffffffff458;
  _Alloc_hider in_stack_fffffffffffff460;
  string *in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  undefined8 in_stack_fffffffffffff478;
  allocator<char> local_b7e;
  allocator<char> local_b7d;
  allocator<char> local_b7c;
  allocator<char> local_b7b;
  allocator<char> local_b7a;
  allocator<char> local_b79;
  pointer local_b78;
  _Alloc_hider _Stack_b70;
  pointer local_b68;
  allocator<char> local_b5a;
  allocator<char> local_b59 [31];
  allocator<char> local_b3a;
  allocator<char> local_b39 [7];
  allocator<char> local_b32;
  allocator<char> local_b31 [7];
  allocator<char> local_b2a;
  allocator<char> local_b29 [8];
  allocator<char> local_b21 [31];
  allocator<char> local_b02;
  allocator<char> local_b01 [113];
  RPCMethodImpl *in_stack_fffffffffffff570;
  undefined1 local_468 [1056];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  examples = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  local_b29[1] = (allocator<char>)0x0;
  local_b29[2] = (allocator<char>)0x0;
  local_b29[3] = (allocator<char>)0x0;
  local_b29[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff318,&in_stack_fffffffffffff310->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::__cxx11::string::string(in_stack_fffffffffffff320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff308);
  RPCArg::RPCArg(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                 (Type)((ulong)in_stack_fffffffffffff370 >> 0x20),in_stack_fffffffffffff368,
                 in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  local_b31[1] = (allocator<char>)0x0;
  local_b31[2] = (allocator<char>)0x0;
  local_b31[3] = (allocator<char>)0x0;
  local_b31[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff318,&in_stack_fffffffffffff310->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::__cxx11::string::string(in_stack_fffffffffffff320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff308);
  RPCArg::RPCArg(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                 (Type)((ulong)in_stack_fffffffffffff370 >> 0x20),in_stack_fffffffffffff368,
                 in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  local_b39[1] = (allocator<char>)0x0;
  local_b39[2] = (allocator<char>)0x0;
  local_b39[3] = (allocator<char>)0x0;
  local_b39[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff348,(int *)in_stack_fffffffffffff340);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::__cxx11::string::string(in_stack_fffffffffffff320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff308);
  RPCArg::RPCArg(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                 (Type)((ulong)in_stack_fffffffffffff370 >> 0x20),in_stack_fffffffffffff368,
                 in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  local_b59[0x1e] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff348,(bool *)in_stack_fffffffffffff340);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  std::operator+(&in_stack_fffffffffffff358->skip_type_check,&in_stack_fffffffffffff350->m_names);
  std::__cxx11::string::string(in_stack_fffffffffffff320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff308);
  RPCArg::RPCArg(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                 (Type)((ulong)in_stack_fffffffffffff370 >> 0x20),in_stack_fffffffffffff368,
                 in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff368 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff308);
  __l._M_len = (size_type)in_stack_fffffffffffff358;
  __l._M_array = in_stack_fffffffffffff350;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff348,__l,
             (allocator_type *)in_stack_fffffffffffff340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  local_b78 = (pointer)0x0;
  _Stack_b70._M_p = (pointer)0x0;
  local_b68 = (pointer)0x0;
  this_00 = (RPCResult *)&local_b78;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff308);
  RPCResult::RPCResult
            (this_00,(Type)((ulong)in_stack_fffffffffffff388 >> 0x20),
             &in_stack_fffffffffffff380->m_names,in_stack_fffffffffffff378,in_stack_fffffffffffff370
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff388,(RPCResult *)in_stack_fffffffffffff380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  HelpExampleCli(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  HelpExampleCli(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::operator+(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350,
             (allocator<char> *)in_stack_fffffffffffff348);
  HelpExampleRpc(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::operator+(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff308,(string *)0x135536a);
  this = (RPCArg *)&stack0xfffffffffffff460;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<setban()::__0,void>
            (in_stack_fffffffffffff318,(anon_class_1_0_00000001 *)in_stack_fffffffffffff310);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff478,(string *)in_stack_fffffffffffff470,
             in_stack_fffffffffffff468,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff460._M_p,
             in_stack_fffffffffffff458,(RPCExamples *)examples,in_stack_fffffffffffff570);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b7e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b7d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b7c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b7b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b79);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff318);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b59);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff318);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_468;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b3a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b39);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b32);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b31);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b2a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b29);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b21);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b02);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan setban()
{
    return RPCHelpMan{"setban",
                "\nAttempts to add or remove an IP/Subnet from the banned list.\n",
                {
                    {"subnet", RPCArg::Type::STR, RPCArg::Optional::NO, "The IP/Subnet (see getpeerinfo for nodes IP) with an optional netmask (default is /32 = single IP)"},
                    {"command", RPCArg::Type::STR, RPCArg::Optional::NO, "'add' to add an IP/Subnet to the list, 'remove' to remove an IP/Subnet from the list"},
                    {"bantime", RPCArg::Type::NUM, RPCArg::Default{0}, "time in seconds how long (or until when if [absolute] is set) the IP is banned (0 or empty means using the default time of 24h which can also be overwritten by the -bantime startup argument)"},
                    {"absolute", RPCArg::Type::BOOL, RPCArg::Default{false}, "If set, the bantime must be an absolute timestamp expressed in " + UNIX_EPOCH_TIME},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("setban", "\"192.168.0.6\" \"add\" 86400")
                            + HelpExampleCli("setban", "\"192.168.0.0/24\" \"add\"")
                            + HelpExampleRpc("setban", "\"192.168.0.6\", \"add\", 86400")
                },
        [&](const RPCHelpMan& help, const JSONRPCRequest& request) -> UniValue
{
    std::string strCommand;
    if (!request.params[1].isNull())
        strCommand = request.params[1].get_str();
    if (strCommand != "add" && strCommand != "remove") {
        throw std::runtime_error(help.ToString());
    }
    NodeContext& node = EnsureAnyNodeContext(request.context);
    BanMan& banman = EnsureBanman(node);

    CSubNet subNet;
    CNetAddr netAddr;
    bool isSubnet = false;

    if (request.params[0].get_str().find('/') != std::string::npos)
        isSubnet = true;

    if (!isSubnet) {
        const std::optional<CNetAddr> addr{LookupHost(request.params[0].get_str(), false)};
        if (addr.has_value()) {
            netAddr = static_cast<CNetAddr>(MaybeFlipIPv6toCJDNS(CService{addr.value(), /*port=*/0}));
        }
    }
    else
        subNet = LookupSubNet(request.params[0].get_str());

    if (! (isSubnet ? subNet.IsValid() : netAddr.IsValid()) )
        throw JSONRPCError(RPC_CLIENT_INVALID_IP_OR_SUBNET, "Error: Invalid IP/Subnet");

    if (strCommand == "add")
    {
        if (isSubnet ? banman.IsBanned(subNet) : banman.IsBanned(netAddr)) {
            throw JSONRPCError(RPC_CLIENT_NODE_ALREADY_ADDED, "Error: IP/Subnet already banned");
        }

        int64_t banTime = 0; //use standard bantime if not specified
        if (!request.params[2].isNull())
            banTime = request.params[2].getInt<int64_t>();

        const bool absolute{request.params[3].isNull() ? false : request.params[3].get_bool()};

        if (absolute && banTime < GetTime()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Error: Absolute timestamp is in the past");
        }

        if (isSubnet) {
            banman.Ban(subNet, banTime, absolute);
            if (node.connman) {
                node.connman->DisconnectNode(subNet);
            }
        } else {
            banman.Ban(netAddr, banTime, absolute);
            if (node.connman) {
                node.connman->DisconnectNode(netAddr);
            }
        }
    }
    else if(strCommand == "remove")
    {
        if (!( isSubnet ? banman.Unban(subNet) : banman.Unban(netAddr) )) {
            throw JSONRPCError(RPC_CLIENT_INVALID_IP_OR_SUBNET, "Error: Unban failed. Requested address/subnet was not previously manually banned.");
        }
    }
    return UniValue::VNULL;
},
    };
}